

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Promise<unsigned_long> *
kj::_::CopyConstructArray_<kj::Promise<unsigned_long>,_kj::Promise<unsigned_long>_*,_true,_false>::
apply(Promise<unsigned_long> *pos,Promise<unsigned_long> *start,Promise<unsigned_long> *end)

{
  ExceptionGuard local_18;
  
  for (; start != end; start = start + 1) {
    (pos->super_PromiseBase).node.ptr = (start->super_PromiseBase).node.ptr;
    (start->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    pos = pos + 1;
  }
  local_18.start = pos;
  local_18.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }